

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifexec(bifcxdef *ctx,int argc)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  int in_ESI;
  undefined8 *in_RDI;
  uint uVar4;
  errdef fr_;
  int hide;
  uchar *p;
  int rem_argc;
  int hide_any;
  ulong flags;
  objnum capture_obj;
  uint capture_end;
  uint capture_start;
  int err;
  objnum iobj;
  objnum prep;
  objnum dobj;
  objnum verb;
  objnum actor;
  objnum in_stack_00001106;
  objnum in_stack_00001108;
  objnum in_stack_0000110a;
  objnum in_stack_0000110c;
  objnum in_stack_0000110e;
  voccxdef *in_stack_00001110;
  int in_stack_00001130;
  int in_stack_00001138;
  undefined4 in_stack_fffffffffffffe58;
  undefined2 in_stack_fffffffffffffe5c;
  mcmon in_stack_fffffffffffffe5e;
  undefined4 in_stack_fffffffffffffe60;
  undefined2 in_stack_fffffffffffffe64;
  mcmon in_stack_fffffffffffffe66;
  bifcxdef *in_stack_fffffffffffffe68;
  runcxdef *in_stack_fffffffffffffe70;
  undefined8 local_180;
  int local_178;
  uint in_stack_fffffffffffffe8c;
  char *in_stack_fffffffffffffe90;
  __jmp_buf_tag _Stack_110;
  uint local_44;
  uchar *local_40;
  int local_38;
  uint local_34;
  runcxdef *local_30;
  mcmon local_26;
  uint local_24;
  uint local_20;
  int local_1c;
  objnum local_16;
  objnum local_14;
  objnum local_12;
  undefined2 local_10;
  undefined2 local_e;
  undefined8 *local_8;
  
  if ((in_ESI < 2) || (6 < in_ESI)) {
    *(undefined4 *)(**(long **)in_RDI[1] + 0x68) = 0;
    runsign((runcxdef *)
            CONCAT26(in_stack_fffffffffffffe66,
                     CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)),
            CONCAT22(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe5c));
  }
  lVar1 = *(long *)(in_RDI[1] + 0x20);
  *(long *)(in_RDI[1] + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) == '\x02') {
    local_e = *(undefined2 *)(*(long *)(in_RDI[1] + 0x20) + 8);
  }
  else {
    if (**(char **)(in_RDI[1] + 0x20) != '\x05') {
      *(undefined4 *)(**(long **)in_RDI[1] + 0x68) = 0;
      runsign((runcxdef *)
              CONCAT26(in_stack_fffffffffffffe66,
                       CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)),
              CONCAT22(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe5c));
    }
    local_e = 0xffff;
  }
  lVar1 = *(long *)(in_RDI[1] + 0x20);
  *(long *)(in_RDI[1] + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) == '\x02') {
    local_10 = *(undefined2 *)(*(long *)(in_RDI[1] + 0x20) + 8);
  }
  else {
    if (**(char **)(in_RDI[1] + 0x20) != '\x05') {
      *(undefined4 *)(**(long **)in_RDI[1] + 0x68) = 0;
      runsign((runcxdef *)
              CONCAT26(in_stack_fffffffffffffe66,
                       CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)),
              CONCAT22(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe5c));
    }
    local_10 = 0xffff;
  }
  local_38 = in_ESI + -2;
  local_8 = in_RDI;
  local_12 = bif_get_optional_obj_arg
                       (in_stack_fffffffffffffe68,
                        (int *)CONCAT26(in_stack_fffffffffffffe66,
                                        CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60
                                                )));
  local_14 = bif_get_optional_obj_arg
                       (in_stack_fffffffffffffe68,
                        (int *)CONCAT26(in_stack_fffffffffffffe66,
                                        CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60
                                                )));
  local_16 = bif_get_optional_obj_arg
                       (in_stack_fffffffffffffe68,
                        (int *)CONCAT26(in_stack_fffffffffffffe66,
                                        CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60
                                                )));
  if (local_38 < 1) {
    local_30 = (runcxdef *)0x0;
  }
  else {
    lVar1 = *(long *)(local_8[1] + 0x20);
    *(long *)(local_8[1] + 0x20) = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) != '\x01') {
      *(undefined4 *)(**(long **)local_8[1] + 0x68) = 0;
      runsign((runcxdef *)
              CONCAT26(in_stack_fffffffffffffe66,
                       CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)),
              CONCAT22(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe5c));
    }
    in_stack_fffffffffffffe70 = *(runcxdef **)(*(long *)(local_8[1] + 0x20) + 8);
    local_38 = local_38 + -1;
    local_30 = in_stack_fffffffffffffe70;
  }
  if (local_38 == 0) {
    local_34 = (uint)(((ulong)local_30 & 3) != 0);
    if (local_34 != 0) {
      tiocapture((tiocxdef *)
                 CONCAT26(in_stack_fffffffffffffe66,
                          CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)),
                 (mcmcxdef *)
                 CONCAT26(in_stack_fffffffffffffe5e,
                          CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),0);
      local_20 = tiocapturesize((tiocxdef *)local_8[2]);
    }
    uVar4 = (uint)(((ulong)local_30 & 4) == 0);
    uVar2 = (uint)(((ulong)local_30 & 8) == 0);
    local_1c = execmd_recurs(in_stack_00001110,in_stack_0000110e,in_stack_0000110c,in_stack_0000110a
                             ,in_stack_00001108,in_stack_00001106,in_stack_00001130,
                             in_stack_00001138);
    if (local_34 != 0) {
      local_24 = tiocapturesize((tiocxdef *)local_8[2]);
      if (local_20 == 0) {
        tiocapture((tiocxdef *)
                   CONCAT26(in_stack_fffffffffffffe66,CONCAT24(in_stack_fffffffffffffe64,uVar2)),
                   (mcmcxdef *)
                   CONCAT26(in_stack_fffffffffffffe5e,CONCAT24(in_stack_fffffffffffffe5c,uVar4)),0);
      }
      if (local_1c == 0) {
        uVar3 = (ulong)local_30 & 1;
      }
      else {
        uVar3 = (ulong)local_30 & 2;
      }
      local_44 = (uint)(uVar3 != 0);
      if (local_44 == 0) {
        if (local_20 == 0) {
          local_26 = tiogetcapture((tiocxdef *)local_8[2]);
          local_40 = mcmlck((mcmcxdef *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe66);
          local_178 = _setjmp(&_Stack_110);
          if (local_178 != 0) {
            *(undefined8 *)*local_8 = local_180;
            mcmunlck((mcmcxdef *)
                     CONCAT26(in_stack_fffffffffffffe66,CONCAT24(in_stack_fffffffffffffe64,uVar2)),
                     in_stack_fffffffffffffe5e);
            errrse1((errcxdef *)
                    CONCAT26(in_stack_fffffffffffffe66,CONCAT24(in_stack_fffffffffffffe64,uVar2)),
                    (errdef *)
                    CONCAT26(in_stack_fffffffffffffe5e,CONCAT24(in_stack_fffffffffffffe5c,uVar4)));
          }
          local_180 = *(undefined8 *)*local_8;
          *(undefined8 **)*local_8 = &local_180;
          outformatlen(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
          *(undefined8 *)*local_8 = local_180;
          mcmunlck((mcmcxdef *)
                   CONCAT26(in_stack_fffffffffffffe66,CONCAT24(in_stack_fffffffffffffe64,uVar2)),
                   in_stack_fffffffffffffe5e);
        }
      }
      else if (local_20 != 0) {
        tiopopcapture((tiocxdef *)local_8[2],local_20);
      }
      if (local_20 == 0) {
        tioclrcapture((tiocxdef *)local_8[2]);
      }
    }
    runpnum(in_stack_fffffffffffffe70,(long)in_stack_fffffffffffffe68);
    return;
  }
  *(char **)(**(long **)local_8[1] + 0x18) = "execCommand";
  *(undefined4 *)(**(long **)local_8[1] + 0x68) = 1;
  runsign((runcxdef *)
          CONCAT26(in_stack_fffffffffffffe66,
                   CONCAT24(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)),
          CONCAT22(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe5c));
}

Assistant:

void bifexec(bifcxdef *ctx, int argc)
{
    objnum actor;
    objnum verb;
    objnum dobj;
    objnum prep;
    objnum iobj;
    int    err;
    uint   capture_start;
    uint   capture_end;
    objnum capture_obj;
    ulong  flags;
    int    hide_any;
    int    rem_argc;
    
    /* 
     *   Check for the correct argument count.  The first two arguments
     *   are required; additional arguments are optional. 
     */
    if (argc < 2 || argc > 6)
        runsig(ctx->bifcxrun, ERR_BIFARGC);

    /* pop the arguments - actor, verb, dobj, prep, iobj */
    actor = runpopobjnil(ctx->bifcxrun);
    verb = runpopobjnil(ctx->bifcxrun);

    /* 
     *   The other object arguments are optional.  If we run into a
     *   numeric argument, it's the flags value, in which case we're out
     *   of objects. 
     */
    rem_argc = argc - 2;
    dobj = bif_get_optional_obj_arg(ctx, &rem_argc);
    prep = bif_get_optional_obj_arg(ctx, &rem_argc);
    iobj = bif_get_optional_obj_arg(ctx, &rem_argc);

    /* if we have a flags argument, pop it */
    if (rem_argc > 0)
    {
        /* the last argument is the flags - pop the numeric value */
        flags = runpopnum(ctx->bifcxrun);

        /* remove it from the remaining argument counter */
        --rem_argc;
    }
    else
    {
        /* no flags specified - use zero by default */
        flags = 0;
    }

    /* 
     *   make sure we don't have any arguments left - if we do, then it
     *   means that we got an incorrect type and skipped an argument when
     *   we were trying to sense the meanings of the arguments from their
     *   types 
     */
    if (rem_argc != 0)
        runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "execCommand");

    /* if we're hiding any output, start output capture */
    hide_any = ((flags & (EC_HIDE_SUCCESS | EC_HIDE_ERROR)) != 0);
    if (hide_any)
    {
        /* start capturing */
        tiocapture(ctx->bifcxtio, ctx->bifcxrun->runcxmem, TRUE);

        /* note the current output position */
        capture_start = tiocapturesize(ctx->bifcxtio);
    }

    /* execute the command */
    err = execmd_recurs(ctx->bifcxrun->runcxvoc,
                        actor, verb, dobj, prep, iobj,
                        (flags & EC_SKIP_VALIDDO) == 0,
                        (flags & EC_SKIP_VALIDIO) == 0);

    /* if we're hiding any output, end hiding */
    if (hide_any)
    {
        uchar *p;
        int hide;
        
        /* get the capture buffer size */
        capture_end = tiocapturesize(ctx->bifcxtio);

        /* turn off capture if it wasn't already on when we started */
        if (capture_start == 0)
            tiocapture(ctx->bifcxtio, ctx->bifcxrun->runcxmem, FALSE);

        /* determine whether we're hiding or showing the result */
        if (err == 0)
            hide = ((flags & EC_HIDE_SUCCESS) != 0);
        else
            hide = ((flags & EC_HIDE_ERROR) != 0);

        /* show or hide the result, as appropriate */
        if (hide)
        {
            /* 
             *   We're hiding this result, so do not display the string.
             *   If there's an enclosing capture, remove the string from
             *   the enclosing capture.  
             */
            if (capture_start != 0)
                tiopopcapture(ctx->bifcxtio, capture_start);
        }
        else
        {
            /* 
             *   We're showing the text.  If we're in an enclosing
             *   capture, do nothing - simply leave the string in the
             *   enclosing capture buffer; otherwise, actually display it 
             */
            if (capture_start == 0)
            {
                /* lock the capture object */
                capture_obj = tiogetcapture(ctx->bifcxtio);
                p = mcmlck(ctx->bifcxrun->runcxmem, capture_obj);
                
                ERRBEGIN(ctx->bifcxerr)
                {
                    /* display the string */
                    outformatlen((char *)p + capture_start,
                                 capture_end - capture_start);
                }
                ERRCLEAN(ctx->bifcxerr)
                {
                    /* unlock the capture object before signalling out */
                    mcmunlck(ctx->bifcxrun->runcxmem, capture_obj);
                }
                ERRENDCLN(ctx->bifcxerr);

                /* unlock the capture object */
                mcmunlck(ctx->bifcxrun->runcxmem, capture_obj);
            }
        }
        
        /* clear the capture buffer if it wasn't on when we started */
        if (capture_start == 0)
            tioclrcapture(ctx->bifcxtio);
    }

    /* push the result code */
    runpnum(ctx->bifcxrun, err);
}